

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_post.c
# Opt level: O3

void test_post_on_response(nhr_request request,nhr_response response)

{
  short sVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  
  lVar3 = nhr_response_get_body(response);
  uVar2 = nhr_response_get_body_length(response);
  lVar4 = nhr_request_get_user_object(request);
  test_post_error = 1;
  printf("\nResponse #%lu:\n",lVar4);
  if (uVar2 != 0 && lVar3 != 0) {
    uVar6 = 0;
    do {
      putchar((int)*(char *)(lVar3 + uVar6));
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  if (lVar4 == 0) {
    test_post_error = 10;
  }
  else {
    sVar1 = nhr_response_get_status_code(response);
    test_post_error = 0xf;
    if (sVar1 == 200) {
      bVar5 = uVar2 == 0 || lVar3 == 0;
      test_post_error = (uint)bVar5 + (uint)bVar5 * 4;
    }
  }
  test_post_working = '\0';
  return;
}

Assistant:

static void test_post_on_response(nhr_request request, nhr_response response) {
	char * body = nhr_response_get_body(response);
	unsigned int body_len = nhr_response_get_body_length(response);
	unsigned long test_number = (unsigned long)nhr_request_get_user_object(request);
	test_post_error = 1;

	printf("\nResponse #%lu:\n", test_number);
	test_post_log_body(body, body_len);
	if (test_number == 0) {
		test_post_error = 10;
		test_post_working = nhr_false;
		return;
	}

	if (nhr_response_get_status_code(response) != 200) {
		test_post_error = 15;
		test_post_working = nhr_false;
		return;
	}

	if (body && body_len) {
		test_post_error = test_post_parse_body(body, test_number);
	} else {
		test_post_error = 5;
	}

	test_post_working = nhr_false;
}